

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_bld.cpp
# Opt level: O0

UConverterSharedData *
ucnv_loadSharedData_63
          (char *converterName,UConverterNamePieces *pPieces,UConverterLoadArgs *pArgs,
          UErrorCode *err)

{
  char cVar1;
  UBool UVar2;
  char *pcVar3;
  UBool local_145;
  UErrorCode local_144;
  UBool checkForAlgorithmic;
  UBool mayContainOption;
  UConverterSharedData *pUStack_140;
  UErrorCode internalErrorCode;
  UConverterSharedData *mySharedConverterData;
  UConverterLoadArgs stackArgs;
  UConverterNamePieces stackPieces;
  UErrorCode *err_local;
  UConverterLoadArgs *pArgs_local;
  UConverterNamePieces *pPieces_local;
  char *converterName_local;
  
  pUStack_140 = (UConverterSharedData *)0x0;
  local_144 = U_ZERO_ERROR;
  local_145 = '\x01';
  UVar2 = U_FAILURE(*err);
  if (UVar2 != '\0') {
    return (UConverterSharedData *)0x0;
  }
  pArgs_local = (UConverterLoadArgs *)pPieces;
  if (pPieces == (UConverterNamePieces *)0x0) {
    if (pArgs != (UConverterLoadArgs *)0x0) {
      *err = U_INTERNAL_PROGRAM_ERROR;
      return (UConverterSharedData *)0x0;
    }
    pArgs_local = (UConverterLoadArgs *)&stackArgs.locale;
  }
  err_local = &pArgs->size;
  if (pArgs == (UConverterLoadArgs *)0x0) {
    memset(&mySharedConverterData,0,0x28);
    mySharedConverterData._0_4_ = 0x28;
    err_local = (UErrorCode *)&mySharedConverterData;
  }
  *(undefined1 *)&pArgs_local->size = 0;
  *(undefined1 *)((long)&pArgs_local[1].pkg + 4) = 0;
  *(undefined4 *)((long)&pArgs_local[5].pkg + 4) = 0;
  *(char **)(err_local + 6) = converterName;
  *(undefined1 **)(err_local + 8) = (undefined1 *)((long)&pArgs_local[1].pkg + U_FILE_ACCESS_ERROR);
  err_local[3] = *(UErrorCode *)((long)&pArgs_local[5].pkg + 4);
  if (converterName == (char *)0x0) {
    *(char **)(err_local + 6) = "UTF-8";
    converterName_local = "(\x01";
    return (UConverterSharedData *)converterName_local;
  }
  if (*converterName == 'U') {
    if ((converterName[1] != 'T') || (converterName[2] != 'F')) goto LAB_00176c50;
  }
  else if (((*converterName != 'u') || (converterName[1] != 't')) || (converterName[2] != 'f'))
  goto LAB_00176c50;
  if (converterName[3] == '-') {
    if (converterName[4] != '8') goto LAB_00176c50;
    cVar1 = converterName[5];
  }
  else {
    if (converterName[3] != '8') goto LAB_00176c50;
    cVar1 = converterName[4];
  }
  if (cVar1 == '\0') {
    *(char **)(err_local + 6) = "UTF-8";
    converterName_local = "(\x01";
    return (UConverterSharedData *)converterName_local;
  }
LAB_00176c50:
  parseConverterOptions
            (converterName,(UConverterNamePieces *)pArgs_local,(UConverterLoadArgs *)err_local,err);
  UVar2 = U_FAILURE(*err);
  if (UVar2 == '\0') {
    pcVar3 = ucnv_io_getConverterName_63(*(char **)(err_local + 6),&local_145,&local_144);
    *(char **)(err_local + 6) = pcVar3;
    UVar2 = U_FAILURE(local_144);
    if ((UVar2 == '\0') && (*(undefined8 *)(err_local + 6) != U_ZERO_ERROR)) {
      if (local_144 == U_AMBIGUOUS_ALIAS_WARNING) {
        *err = U_AMBIGUOUS_ALIAS_WARNING;
      }
    }
    else {
      *(UConverterLoadArgs **)(err_local + 6) = pArgs_local;
    }
    if ((local_145 != '\0') && (*(UConverterLoadArgs **)(err_local + 6) != pArgs_local)) {
      parseConverterOptions
                (*(char **)(err_local + 6),(UConverterNamePieces *)pArgs_local,
                 (UConverterLoadArgs *)err_local,err);
    }
    pUStack_140 = getAlgorithmicTypeFromName(*(char **)(err_local + 6));
    if (pUStack_140 == (UConverterSharedData *)0x0) {
      err_local[1] = U_ILLEGAL_ARGUMENT_ERROR;
      err_local[4] = U_ZERO_ERROR;
      err_local[5] = U_ZERO_ERROR;
      umtx_lock_63(&cnvCacheMutex);
      pUStack_140 = ucnv_load_63((UConverterLoadArgs *)err_local,err);
      umtx_unlock_63(&cnvCacheMutex);
      UVar2 = U_FAILURE(*err);
      if ((UVar2 != '\0') || (pUStack_140 == (UConverterSharedData *)0x0)) {
        return (UConverterSharedData *)0x0;
      }
    }
    converterName_local = (char *)pUStack_140;
  }
  else {
    converterName_local = (char *)0x0;
  }
  return (UConverterSharedData *)converterName_local;
}

Assistant:

U_CFUNC UConverterSharedData *
ucnv_loadSharedData(const char *converterName,
                    UConverterNamePieces *pPieces,
                    UConverterLoadArgs *pArgs,
                    UErrorCode * err) {
    UConverterNamePieces stackPieces;
    UConverterLoadArgs stackArgs;
    UConverterSharedData *mySharedConverterData = NULL;
    UErrorCode internalErrorCode = U_ZERO_ERROR;
    UBool mayContainOption = TRUE;
    UBool checkForAlgorithmic = TRUE;

    if (U_FAILURE (*err)) {
        return NULL;
    }

    if(pPieces == NULL) {
        if(pArgs != NULL) {
            /*
             * Bad: We may set pArgs pointers to stackPieces fields
             * which will be invalid after this function returns.
             */
            *err = U_INTERNAL_PROGRAM_ERROR;
            return NULL;
        }
        pPieces = &stackPieces;
    }
    if(pArgs == NULL) {
        uprv_memset(&stackArgs, 0, sizeof(stackArgs));
        stackArgs.size = (int32_t)sizeof(stackArgs);
        pArgs = &stackArgs;
    }

    pPieces->cnvName[0] = 0;
    pPieces->locale[0] = 0;
    pPieces->options = 0;

    pArgs->name = converterName;
    pArgs->locale = pPieces->locale;
    pArgs->options = pPieces->options;

    /* In case "name" is NULL we want to open the default converter. */
    if (converterName == NULL) {
#if U_CHARSET_IS_UTF8
        pArgs->name = "UTF-8";
        return (UConverterSharedData *)converterData[UCNV_UTF8];
#else
        /* Call ucnv_getDefaultName first to query the name from the OS. */
        pArgs->name = ucnv_getDefaultName();
        if (pArgs->name == NULL) {
            *err = U_MISSING_RESOURCE_ERROR;
            return NULL;
        }
        mySharedConverterData = (UConverterSharedData *)gDefaultAlgorithmicSharedData;
        checkForAlgorithmic = FALSE;
        mayContainOption = gDefaultConverterContainsOption;
        /* the default converter name is already canonical */
#endif
    }
    else if(UCNV_FAST_IS_UTF8(converterName)) {
        /* fastpath for UTF-8 */
        pArgs->name = "UTF-8";
        return (UConverterSharedData *)converterData[UCNV_UTF8];
    }
    else {
        /* separate the converter name from the options */
        parseConverterOptions(converterName, pPieces, pArgs, err);
        if (U_FAILURE(*err)) {
            /* Very bad name used. */
            return NULL;
        }

        /* get the canonical converter name */
        pArgs->name = ucnv_io_getConverterName(pArgs->name, &mayContainOption, &internalErrorCode);
        if (U_FAILURE(internalErrorCode) || pArgs->name == NULL) {
            /*
            * set the input name in case the converter was added
            * without updating the alias table, or when there is no alias table
            */
            pArgs->name = pPieces->cnvName;
        } else if (internalErrorCode == U_AMBIGUOUS_ALIAS_WARNING) {
            *err = U_AMBIGUOUS_ALIAS_WARNING;
        }
    }

    /* separate the converter name from the options */
    if(mayContainOption && pArgs->name != pPieces->cnvName) {
        parseConverterOptions(pArgs->name, pPieces, pArgs, err);
    }

    /* get the shared data for an algorithmic converter, if it is one */
    if (checkForAlgorithmic) {
        mySharedConverterData = (UConverterSharedData *)getAlgorithmicTypeFromName(pArgs->name);
    }
    if (mySharedConverterData == NULL)
    {
        /* it is a data-based converter, get its shared data.               */
        /* Hold the cnvCacheMutex through the whole process of checking the */
        /*   converter data cache, and adding new entries to the cache      */
        /*   to prevent other threads from modifying the cache during the   */
        /*   process.                                                       */
        pArgs->nestedLoads=1;
        pArgs->pkg=NULL;

        umtx_lock(&cnvCacheMutex);
        mySharedConverterData = ucnv_load(pArgs, err);
        umtx_unlock(&cnvCacheMutex);
        if (U_FAILURE (*err) || (mySharedConverterData == NULL))
        {
            return NULL;
        }
    }

    return mySharedConverterData;
}